

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O2

bool __thiscall ServerManager::freeServer(ServerManager *this,IRC_Bot *server)

{
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *puVar1;
  const_iterator __position;
  
  __position._M_current =
       (this->m_servers).
       super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_servers).
           super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__position._M_current == puVar1) {
LAB_0011304d:
      return __position._M_current != puVar1;
    }
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
        super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
        super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl == server) {
      std::
      vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
      ::erase(&this->m_servers,__position);
      goto LAB_0011304d;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

bool ServerManager::freeServer(IRC_Bot *server) {
	for (auto itr = m_servers.begin(); itr != m_servers.end(); ++itr) {
		if (itr->get() == server) {
			m_servers.erase(itr);
			return true;
		}
	}

	return false;
}